

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O0

StackAction summarize_stack_callback(void *payload,StackIterator *iterator)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined4 local_4c;
  StackSummaryEntry entry;
  uint i;
  uint depth;
  TSStateId state;
  SummarizeStackSession *session;
  StackIterator *iterator_local;
  void *payload_local;
  
  uVar1 = iterator->node->state;
  uVar2 = iterator->subtree_count;
  if (*(uint *)((long)payload + 8) < uVar2) {
    payload_local._4_4_ = 1;
  }
  else {
    entry.depth = *(uint *)(*payload + 8);
    do {
      entry.depth = entry.depth - 1;
      if (entry.depth == 0xffffffff) {
LAB_00131233:
        array__grow(*payload,0x14);
        lVar5 = **payload;
        uVar3 = *(uint *)(*payload + 8);
        *(uint *)(*payload + 8) = uVar3 + 1;
        puVar6 = (undefined8 *)(lVar5 + (ulong)uVar3 * 0x14);
        uVar4 = (iterator->node->position).extent.column;
        local_4c = CONCAT22(local_4c._2_2_,uVar1);
        *puVar6 = *(undefined8 *)&iterator->node->position;
        puVar6[1] = CONCAT44(uVar2,uVar4);
        *(undefined4 *)(puVar6 + 2) = local_4c;
        return 0;
      }
      lVar5 = **payload + (ulong)entry.depth * 0x14;
      entry.position.extent.row = (uint32_t)((ulong)*(undefined8 *)(lVar5 + 8) >> 0x20);
      if (entry.position.extent.row < uVar2) goto LAB_00131233;
    } while ((entry.position.extent.row != uVar2) ||
            ((*(uint *)(lVar5 + 0x10) & 0xffff) != (uint)uVar1));
    payload_local._4_4_ = 0;
  }
  return payload_local._4_4_;
}

Assistant:

inline StackAction summarize_stack_callback(void *payload, const StackIterator *iterator) {
  SummarizeStackSession *session = payload;
  TSStateId state = iterator->node->state;
  unsigned depth = iterator->subtree_count;
  if (depth > session->max_depth) return StackActionStop;
  for (unsigned i = session->summary->size - 1; i + 1 > 0; i--) {
    StackSummaryEntry entry = session->summary->contents[i];
    if (entry.depth < depth) break;
    if (entry.depth == depth && entry.state == state) return StackActionNone;
  }
  array_push(session->summary, ((StackSummaryEntry){
    .position = iterator->node->position,
    .depth = depth,
    .state = state,
  }));
  return StackActionNone;
}